

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

PrecisionCase *
vkt::shaderexecutor::
createFuncCase<vkt::shaderexecutor::Signature<float,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
          (CaseContext *context,string *name,
          Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *func)

{
  int iVar1;
  Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *func_local;
  string *name_local;
  CaseContext *context_local;
  
  iVar1 = (*(func->super_FuncBase)._vptr_FuncBase[5])();
  if (iVar1 == -1) {
    context_local = (CaseContext *)operator_new(0x200);
    FuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::FuncCase((FuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                *)context_local,context,name,func);
  }
  else if (iVar1 == 1) {
    context_local = (CaseContext *)operator_new(0x200);
    InOutFuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
    ::InOutFuncCase((InOutFuncCase<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
                     *)context_local,context,name,func);
  }
  else {
    context_local = (CaseContext *)0x0;
  }
  return (PrecisionCase *)context_local;
}

Assistant:

PrecisionCase* createFuncCase (const CaseContext& context, const string& name, const Func<Sig>&	func)
{
	switch (func.getOutParamIndex())
	{
		case -1:
			return new FuncCase<Sig>(context, name, func);
		case 1:
			return new InOutFuncCase<Sig>(context, name, func);
		default:
			DE_FATAL("Impossible");
	}
	return DE_NULL;
}